

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoding.cc
# Opt level: O3

string * __thiscall
phosg::rot13_abi_cxx11_(string *__return_storage_ptr__,phosg *this,void *vdata,size_t size)

{
  phosg pVar1;
  phosg __c;
  void *pvVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (vdata != (void *)0x0) {
    pvVar2 = (void *)0x0;
    do {
      pVar1 = this[(long)pvVar2];
      if ((byte)(((byte)pVar1 & 0xdf) + 0xbf) < 0xd) {
        __c = (phosg)((char)pVar1 + 0xd);
      }
      else {
        __c = (phosg)((char)pVar1 - 0xd);
        if (0xc < (byte)(((byte)pVar1 & 0xdf) + 0xb2)) {
          __c = pVar1;
        }
      }
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,(char)__c);
      pvVar2 = (void *)((long)pvVar2 + 1);
    } while (vdata != pvVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

string rot13(const void* vdata, size_t size) {
  const char* data = reinterpret_cast<const char*>(vdata);
  string ret;
  for (size_t x = 0; x < size; x++) {
    char ch = data[x];
    if (((ch >= 'a') && (ch <= 'm')) || ((ch >= 'A') && (ch <= 'M'))) {
      ch += 13;
    } else if (((ch >= 'n') && (ch <= 'z')) || ((ch >= 'N') && (ch <= 'Z'))) {
      ch -= 13;
    }
    ret.push_back(ch);
  }
  return ret;
}